

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O1

symbol * evaluate_preop(dmr_C *C,expression *expr)

{
  expression **ppeVar1;
  byte bVar2;
  statement *psVar3;
  position pVar4;
  statement *psVar5;
  ulong uVar6;
  symbol_list *psVar7;
  statement *psVar8;
  statement *psVar9;
  expression *peVar10;
  undefined8 uVar11;
  statement *psVar12;
  ident *piVar13;
  symbol *psVar14;
  anon_union_8_2_e1606681_for_symbol_12 aVar15;
  anon_union_136_3_e2189aaa_for_symbol_15 *paVar16;
  statement_type sVar17;
  undefined4 uVar18;
  int iVar19;
  symbol *psVar20;
  string *psVar21;
  symbol *psVar22;
  char *pcVar23;
  expression *peVar24;
  symbol *psVar25;
  uint uVar26;
  symbol *local_38;
  
  psVar3 = (expr->field_5).statement;
  psVar20 = (psVar3->field_2).field_5.label_identifier;
  iVar19 = expr->op;
  local_38 = psVar20;
  if (iVar19 < 0x7e) {
    switch(iVar19) {
    case 0x21:
      if ((0xff < *(ushort *)expr) && ((psVar3->type & 0x100) == STMT_NONE)) {
        *(ushort *)expr = *(ushort *)expr & 0xff;
      }
      if ((*(byte *)((long)&psVar20->field_14 + 0x1b) & 8) != 0) {
        dmrC_warning(C,expr->pos,"testing a \'safe expression\'");
      }
      psVar25 = psVar20;
      if (*(char *)psVar20 == '\x03') {
        psVar25 = (psVar20->field_14).field_2.ctype.base_type;
      }
      if ((psVar25->field_14).field_2.ctype.base_type == &C->S->fp_type) {
        *(undefined1 *)expr = 0x16;
        expr->op = 0x10a;
        pVar4 = expr->pos;
        psVar21 = (string *)dmrC_allocator_allocate(&C->expression_allocator,0);
        *(undefined1 *)psVar21 = 0x1c;
        *(position *)(psVar21 + 2) = pVar4;
        (expr->field_5).field_2.string = psVar21;
        *(symbol **)(psVar21 + 4) = psVar20;
        (((expr->field_5).field_6.right)->field_5).fvalue = (longdouble)0;
      }
      else {
        psVar25 = psVar20;
        if (*(char *)psVar20 == '\x03') {
          psVar25 = *(symbol **)((long)&psVar20->field_14 + 0x38);
        }
        if (*(char *)psVar25 == '\t') {
          psVar25 = *(symbol **)((long)&psVar25->field_14 + 0x38);
        }
        if (*(char *)psVar25 == '\x10') {
          pcVar23 = dmrC_show_typename(C,(psVar20->field_14).field_2.ctype.base_type);
          dmrC_warning(C,expr->pos,"%s degrades to integer",pcVar23);
        }
      }
      local_38 = &C->S->int_ctype;
      break;
    case 0x26:
      if ((*(int *)&psVar3->pos != 0x2a) || ((char)psVar3->type != STMT_LABEL)) {
        pcVar23 = "not addressable";
        goto LAB_0010c962;
      }
      psVar3 = (psVar3->field_2).field_3.if_false;
      uVar18 = *(undefined4 *)&(psVar3->pos).field_0x0;
      pVar4 = *(position *)&(psVar3->pos).field_0x4;
      psVar7 = (psVar3->field_2).field_0.declaration;
      peVar24 = (psVar3->field_2).field_1.context;
      psVar5 = (psVar3->field_2).field_3.if_false;
      psVar8 = (psVar3->field_2).field_4.args;
      peVar10 = (psVar3->field_2).field_8.iterator_pre_condition;
      psVar9 = (psVar3->field_2).field_8.iterator_statement;
      *(statement_type *)&expr->field_0x0 = psVar3->type;
      expr->op = uVar18;
      expr->pos = pVar4;
      (expr->field_5).field_10.cond_false = peVar10;
      (expr->field_5).field_14.ident_expression = (expression *)psVar9;
      (expr->field_5).field_0.value = (unsigned_long_long)psVar5;
      (expr->field_5).field_2.string = (string *)psVar8;
      expr->ctype = (symbol *)psVar7;
      *(expression **)&expr->field_0x18 = peVar24;
      bVar2 = *(byte *)expr;
      *(ushort *)expr = (ushort)bVar2;
      if (bVar2 == 3) {
        ppeVar1 = ((expr->field_5).expr_list)->list_ + 8;
        *ppeVar1 = (expression *)((ulong)*ppeVar1 | 0x80000);
      }
      if (expr->ctype == &C->S->lazy_ptr_ctype) {
        psVar20 = create_pointer(C,expr,psVar20,0);
        expr->ctype = psVar20;
      }
LAB_0010c6c7:
      return expr->ctype;
    case 0x28:
      sVar17 = psVar3->type;
      uVar18 = *(undefined4 *)&(psVar3->pos).field_0x0;
      pVar4 = *(position *)&(psVar3->pos).field_0x4;
      psVar7 = (psVar3->field_2).field_0.declaration;
      peVar24 = (psVar3->field_2).field_1.context;
      psVar5 = (psVar3->field_2).field_3.if_false;
      psVar8 = (psVar3->field_2).field_4.args;
      psVar9 = (psVar3->field_2).field_8.iterator_statement;
      (expr->field_5).field_10.cond_false = (psVar3->field_2).field_8.iterator_pre_condition;
      (expr->field_5).field_14.ident_expression = (expression *)psVar9;
      (expr->field_5).field_0.value = (unsigned_long_long)psVar5;
      (expr->field_5).field_2.string = (string *)psVar8;
      expr->ctype = (symbol *)psVar7;
      *(expression **)&expr->field_0x18 = peVar24;
      *(statement_type *)&expr->field_0x0 = sVar17;
      expr->op = uVar18;
      expr->pos = pVar4;
      return psVar20;
    case 0x2a:
      if (((char)psVar3->type == STMT_LABEL) && (*(int *)&psVar3->pos == 0x26)) {
        psVar3 = (psVar3->field_2).field_3.if_false;
        uVar18 = *(undefined4 *)&(psVar3->pos).field_0x0;
        pVar4 = *(position *)&(psVar3->pos).field_0x4;
        psVar7 = (psVar3->field_2).field_0.declaration;
        peVar24 = (psVar3->field_2).field_1.context;
        psVar5 = (psVar3->field_2).field_3.if_false;
        psVar8 = (psVar3->field_2).field_4.args;
        peVar10 = (psVar3->field_2).field_8.iterator_pre_condition;
        psVar9 = (psVar3->field_2).field_8.iterator_statement;
        *(statement_type *)&expr->field_0x0 = psVar3->type;
        expr->op = uVar18;
        expr->pos = pVar4;
        expr->ctype = (symbol *)psVar7;
        *(expression **)&expr->field_0x18 = peVar24;
        (expr->field_5).field_10.cond_false = peVar10;
        (expr->field_5).field_14.ident_expression = (expression *)psVar9;
        (expr->field_5).field_0.value = (unsigned_long_long)psVar5;
        (expr->field_5).field_2.string = (string *)psVar8;
        expr->field_0x1 = 0;
        goto LAB_0010c6c7;
      }
      dmrC_examine_symbol_type(C->S,psVar20);
      if (*(char *)psVar20 == '\x03') {
        psVar20 = *(symbol **)((long)&psVar20->field_14 + 0x38);
      }
      psVar22 = dmrC_alloc_symbol(C->S,expr->pos,3);
      psVar25 = (psVar20->field_14).field_2.ctype.base_type;
      if (*(char *)psVar20 == '\x04') {
        *(ulong *)((long)&psVar22->field_14 + 0x18) =
             (ulong)((uint)(psVar25->field_14).field_2.ctype.modifiers & 0x40001fc0);
      }
      else {
        if (*(char *)psVar20 != '\x06') {
          pcVar23 = "cannot dereference this type";
LAB_0010c962:
          dmrC_expression_error(C,expr,pcVar23);
          return (symbol *)0x0;
        }
        if (((char)psVar3->type != STMT_LABEL) || (*(int *)&psVar3->pos != 0x2a)) {
          pcVar23 = "non-lvalue array??";
          expr = (expression *)psVar3;
          goto LAB_0010c962;
        }
        psVar5 = (psVar3->field_2).field_3.if_false;
        sVar17 = psVar5->type;
        uVar18 = *(undefined4 *)&(psVar5->pos).field_0x0;
        uVar11 = *(undefined8 *)&(psVar5->pos).field_0x4;
        peVar24 = (psVar5->field_2).field_1.context;
        psVar8 = (psVar5->field_2).field_3.if_false;
        psVar9 = (psVar5->field_2).field_4.args;
        peVar10 = (psVar5->field_2).field_8.iterator_pre_condition;
        psVar12 = (psVar5->field_2).field_8.iterator_statement;
        (psVar3->field_2).field_0.declaration = (psVar5->field_2).field_0.declaration;
        (psVar3->field_2).field_1.context = peVar24;
        psVar3->type = sVar17;
        *(undefined4 *)&(psVar3->pos).field_0x0 = uVar18;
        *(undefined8 *)&(psVar3->pos).field_0x4 = uVar11;
        (psVar3->field_2).field_8.iterator_pre_condition = peVar10;
        (psVar3->field_2).field_8.iterator_statement = psVar12;
        (psVar3->field_2).field_3.if_false = psVar8;
        (psVar3->field_2).field_4.args = psVar9;
        dmrC_merge_type(psVar22,(psVar3->field_2).field_5.label_identifier);
      }
      dmrC_merge_type(psVar22,psVar20);
      (psVar22->field_14).field_1.normal = (psVar25->field_14).field_1.normal;
      (psVar22->field_14).field_0.used_in = (psVar25->field_14).field_0.used_in;
      local_38 = psVar22;
      break;
    case 0x2b:
    case 0x2d:
      goto switchD_0010c4bb_caseD_2b;
    }
    goto switchD_0010c4bb_caseD_22;
  }
  if (iVar19 != 0x7e) {
    if ((iVar19 == 0x101) || (iVar19 == 0x103)) {
      psVar20 = evaluate_postop(C,expr);
      return psVar20;
    }
    goto switchD_0010c4bb_caseD_22;
  }
switchD_0010c4bb_caseD_2b:
  if (*(char *)psVar20 == '\x03') {
    local_38 = *(symbol **)((long)&psVar20->field_14 + 0x38);
  }
  if (*(byte *)local_38 == 0xb) {
    paVar16 = &local_38->field_14;
    local_38 = psVar20;
    local_38 = dmrC_evaluate_expression(C,(paVar16->field_2).initializer);
    if (local_38 == (symbol *)0x0) {
      local_38 = &C->S->bad_ctype;
    }
    else if (*(char *)local_38 == '\x03') {
      local_38 = *(symbol **)((long)&local_38->field_14 + 0x38);
    }
  }
  if (*(byte *)local_38 == 9) {
    local_38 = *(symbol **)((long)&local_38->field_14 + 0x38);
  }
  if ((ulong)*(byte *)local_38 == 2) {
    psVar20 = (local_38->field_14).field_2.ctype.base_type;
    if (psVar20 == &C->S->int_type) {
      uVar26 = 1;
    }
    else {
      if (psVar20 != &C->S->fp_type) goto LAB_0010c747;
      uVar26 = 9;
    }
  }
  else {
LAB_0010c747:
    uVar26 = classify_type::type_class[*(byte *)local_38];
  }
  if ((0xff < *(ushort *)expr) && ((((expr->field_5).statement)->type & 0x100) == STMT_NONE)) {
    *(ushort *)expr = *(ushort *)expr & 0xff;
  }
  if ((uVar26 & 1) != 0) {
    if (((uVar26 & 4) != 0) && (iVar19 = restricted_unop(C,expr->op,&local_38), iVar19 != 0)) {
      if ((uVar26 & 0x40) != 0) {
        local_38 = (local_38->field_14).field_2.ctype.base_type;
      }
      psVar20 = local_38;
      pcVar23 = dmrC_show_typename(C,local_38);
      dmrC_warning(C,expr->pos,"%s degrades to integer",pcVar23);
      local_38 = *(symbol **)((long)&psVar20->field_14 + 0x38);
    }
    if ((uVar26 & 8) == 0) {
      paVar16 = &local_38->field_14;
      if (*(byte *)local_38 == 0xd) {
        local_38 = (local_38->field_14).field_2.ctype.base_type;
      }
      if ((paVar16->field_1).normal < C->target->bits_in_int) {
        local_38 = &C->S->int_ctype;
      }
      else {
        uVar6 = (local_38->field_14).field_2.ctype.modifiers;
        if ((uVar6 & 0x300) != 0) {
          if ((char)uVar6 < '\0') {
            local_38 = &C->S->uint_ctype;
          }
          else {
            local_38 = &C->S->int_ctype;
          }
        }
      }
      peVar24 = cast_to(C,(expr->field_5).field_3.unop,local_38);
      (expr->field_5).field_3.unop = peVar24;
    }
    else if (expr->op == 0x7e) goto LAB_0010c858;
    if (expr->op == 0x2b) {
      psVar20 = (expr->field_5).field_4.symbol;
      uVar18 = *(undefined4 *)&(psVar20->pos).field_0x0;
      pVar4 = *(position *)&(psVar20->pos).field_0x4;
      psVar25 = *(symbol **)&(psVar20->endpos).field_0x4;
      piVar13 = psVar20->ident;
      psVar22 = psVar20->next_id;
      psVar14 = psVar20->replace;
      peVar24 = (expression *)psVar20->scope;
      aVar15 = psVar20->field_12;
      *(undefined4 *)&expr->field_0x0 = *(undefined4 *)&psVar20->field_0x0;
      expr->op = uVar18;
      expr->pos = pVar4;
      expr->ctype = psVar25;
      *(ident **)&expr->field_0x18 = piVar13;
      (expr->field_5).field_10.cond_false = peVar24;
      (expr->field_5).field_14.ident_expression = (expression *)aVar15;
      (expr->field_5).field_0.value = (unsigned_long_long)psVar22;
      (expr->field_5).field_2.string = (string *)psVar14;
    }
switchD_0010c4bb_caseD_22:
    expr->ctype = local_38;
    return local_38;
  }
LAB_0010c858:
  psVar20 = bad_expr_type(C,expr);
  return psVar20;
}

Assistant:

static struct symbol *evaluate_preop(struct dmr_C *C, struct expression *expr)
{
	struct symbol *ctype = expr->unop->ctype;

	switch (expr->op) {
	case '(':
		*expr = *expr->unop;
		return ctype;

	case '+':
	case '-':
	case '~':
		return evaluate_sign(C, expr);

	case '*':
		return evaluate_dereference(C, expr);

	case '&':
		return evaluate_addressof(C, expr);

	case SPECIAL_INCREMENT:
	case SPECIAL_DECREMENT:
		/*
		 * From a type evaluation standpoint the preops are
		 * the same as the postops
		 */
		return evaluate_postop(C, expr);

	case '!':
		if (expr->flags && !(expr->unop->flags & Int_const_expr))
			expr->flags = 0;
		if (is_safe_type(ctype))
			dmrC_warning(C, expr->pos, "testing a 'safe expression'");
		if (dmrC_is_float_type(C->S, ctype)) {
			struct expression *arg = expr->unop;
			expr->type = EXPR_COMPARE;
			expr->op = SPECIAL_EQUAL;
			expr->left = arg;
			expr->right = dmrC_alloc_expression(C, expr->pos, EXPR_FVALUE);
			expr->right->ctype = ctype;
			expr->right->fvalue = 0;
		} else if (dmrC_is_fouled_type(ctype)) {
			dmrC_warning(C, expr->pos, "%s degrades to integer",
				dmrC_show_typename(C, ctype->ctype.base_type));
		}
		/* the result is int [6.5.3.3(5)]*/
		ctype = &C->S->int_ctype;
		break;

	default:
		break;
	}
	expr->ctype = ctype;
	return ctype;
}